

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O1

shared_ptr<polyscope::render::AttributeBuffer> __thiscall
polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>::
getIndexedRenderAttributeBuffer
          (ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_> *this,
          ManagedBuffer<unsigned_int> *indices)

{
  pointer ptVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RCX;
  ManagedBuffer<unsigned_int> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>
  *existingViewTup;
  pointer ptVar4;
  bool bVar5;
  bool bVar6;
  shared_ptr<polyscope::render::AttributeBuffer> sVar7;
  vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_>
  expandData;
  vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_>
  local_50;
  ManagedBuffer<unsigned_int> *local_38;
  
  checkDeviceBufferTypeIs
            ((ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_> *)indices,
             Attribute);
  removeDeletedIndexedViews
            ((ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_> *)indices);
  ptVar4 = (indices->existingIndexedViews).
           super__Vector_base<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ptVar1 = (indices->existingIndexedViews).
           super__Vector_base<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    bVar5 = ptVar4 == ptVar1;
    if (bVar5) {
LAB_0021f14f:
      ensureHostBufferPopulated
                ((ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_> *)indices);
      generateAttributeBuffer<std::array<glm::vec<3,float,(glm::qualifier)0>,4ul>>
                ((render *)this,render::engine);
      ManagedBuffer<unsigned_int>::ensureHostBufferPopulated(in_RDX);
      gather<std::array<glm::vec<3,float,(glm::qualifier)0>,4ul>>
                (&local_50,(polyscope *)indices->data,
                 (vector<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_>
                  *)in_RDX->data,in_RCX);
      (**(code **)(*this->_vptr_ManagedBuffer + 0x70))(this->_vptr_ManagedBuffer,&local_50);
      std::
      vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>*,std::weak_ptr<polyscope::render::AttributeBuffer>>,std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>*,std::weak_ptr<polyscope::render::AttributeBuffer>>>>
      ::
      emplace_back<polyscope::render::ManagedBuffer<unsigned_int>*,std::shared_ptr<polyscope::render::AttributeBuffer>&>
                ((vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>*,std::weak_ptr<polyscope::render::AttributeBuffer>>,std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>*,std::weak_ptr<polyscope::render::AttributeBuffer>>>>
                  *)&indices->existingIndexedViews,&local_38,
                 (shared_ptr<polyscope::render::AttributeBuffer> *)this);
      _Var3._M_pi = extraout_RDX_01;
      if (local_50.
          super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.
                        super__Vector_base<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>,_std::allocator<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        _Var3._M_pi = extraout_RDX_02;
      }
LAB_0021f1be:
      sVar7.super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var3._M_pi;
      sVar7.super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)this;
      return (shared_ptr<polyscope::render::AttributeBuffer>)
             sVar7.
             super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::__shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2> *)this,
               ptVar4);
    if (this->_vptr_ManagedBuffer == (_func_int **)0x0) {
      bVar2 = true;
      bVar6 = false;
    }
    else {
      bVar6 = ((ptVar4->
               super__Tuple_impl<0UL,_polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>
               ).super__Head_base<0UL,_polyscope::render::ManagedBuffer<unsigned_int>_*,_false>.
              _M_head_impl)->uniqueID == in_RDX->uniqueID;
      bVar2 = !bVar6;
    }
    _Var3._M_pi = extraout_RDX;
    if ((!bVar6) &&
       (this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->name)._M_dataplus._M_p,
       this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      _Var3._M_pi = extraout_RDX_00;
    }
    if (!bVar2) {
      if (!bVar5) goto LAB_0021f1be;
      goto LAB_0021f14f;
    }
    ptVar4 = ptVar4 + 1;
  } while( true );
}

Assistant:

std::shared_ptr<render::AttributeBuffer>
ManagedBuffer<T>::getIndexedRenderAttributeBuffer(ManagedBuffer<uint32_t>& indices) {
  checkDeviceBufferTypeIs(DeviceBufferType::Attribute);

  removeDeletedIndexedViews(); // periodic filtering

  // Check if we have already created this indexed view, and if so just return it
  for (std::tuple<render::ManagedBuffer<uint32_t>*, std::weak_ptr<render::AttributeBuffer>>& existingViewTup :
       existingIndexedViews) {

    // both the cache-key source index ptr and the view buffer ptr must still be alive (and the index must match)
    // note that we can't verify that the index buffer is still alive, you will just get memory errors here if it
    // has been deleted
    std::shared_ptr<render::AttributeBuffer> viewBufferPtr = std::get<1>(existingViewTup).lock();
    if (viewBufferPtr) {
      render::ManagedBuffer<uint32_t>& indexBufferCand = *(std::get<0>(existingViewTup));
      if (indexBufferCand.uniqueID == indices.uniqueID) {
        return viewBufferPtr;
      }
    }
  }

  // We don't have it. Create a new one and return that.
  ensureHostBufferPopulated();
  std::shared_ptr<render::AttributeBuffer> newBuffer = generateAttributeBuffer<T>(render::engine);
  indices.ensureHostBufferPopulated();
  std::vector<T> expandData = gather(data, indices.data);
  newBuffer->setData(expandData); // initially populate
  existingIndexedViews.emplace_back(&indices, newBuffer);

  return newBuffer;
}